

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  ClauseAllocator *this_00;
  vec<Minisat::Lit,_int> *out_clause;
  int iVar1;
  Var VVar2;
  bool bVar3;
  lbool lVar4;
  char *pcVar5;
  vec<unsigned_int,_int> *pvVar6;
  uint *puVar7;
  Clause *pCVar8;
  Clause *pCVar9;
  vec<Minisat::Solver::Watcher,_int> *pvVar10;
  ulong uVar11;
  int i_1;
  Lit x;
  ulong uVar12;
  vec<unsigned_int,_int> *pvVar13;
  ulong uVar14;
  int j;
  long lVar15;
  int i;
  long lVar16;
  SimpSolver *pSVar17;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  *this_01;
  Var v_local;
  SimpSolver *local_68;
  int local_60;
  int clause_size;
  vec<unsigned_int,_int> pos;
  vec<unsigned_int,_int> neg;
  
  v_local = v;
  pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                     (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v);
  if (*pcVar5 != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e7,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  bVar3 = isEliminated(this,v);
  if (bVar3) {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e8,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  lVar4 = Solver::value(&this->super_Solver,v);
  pos.data = (uint *)CONCAT71(pos.data._1_7_,lVar4.value);
  bVar3 = lbool::operator==((lbool *)&pos,l_Undef);
  if (!bVar3) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/simp/SimpSolver.cc"
                  ,0x1e9,"bool Minisat::SimpSolver::eliminateVar(Var)");
  }
  pvVar6 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
           ::lookup(&this->occurs,&v_local);
  pos.data = (uint *)0x0;
  pos.sz = 0;
  pos.cap = 0;
  neg.data = (uint *)0x0;
  neg.sz = 0;
  neg.cap = 0;
  this_00 = &(this->super_Solver).ca;
  lVar16 = 0;
  local_68 = this;
  do {
    if (pvVar6->sz <= lVar16) {
      clause_size = 0;
      local_60 = 0;
      for (lVar16 = 0; pSVar17 = local_68, lVar16 < pos.sz; lVar16 = lVar16 + 1) {
        for (lVar15 = 0; lVar15 < neg.sz; lVar15 = lVar15 + 1) {
          pCVar8 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[](&this_00->ra,pos.data[lVar16]);
          pCVar9 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[](&this_00->ra,neg.data[lVar15]);
          pSVar17 = local_68;
          bVar3 = merge(local_68,pCVar8,pCVar9,v_local,&clause_size);
          if (bVar3) {
            bVar3 = true;
            if (*(int *)&(pSVar17->super_Solver).field_0x35c + pvVar6->sz <= local_60)
            goto LAB_00111f4e;
            local_60 = local_60 + 1;
            iVar1 = pSVar17->clause_lim;
            if ((iVar1 != -1) && (iVar1 < clause_size)) goto LAB_00111f4e;
          }
        }
      }
      pcVar5 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(local_68->eliminated).
                           super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v_local);
      *pcVar5 = '\x01';
      Solver::setDecisionVar(&pSVar17->super_Solver,v_local,false);
      pSVar17->eliminated_vars = pSVar17->eliminated_vars + 1;
      pvVar13 = &pSVar17->elimclauses;
      lVar16 = 0;
      if (neg.sz < pos.sz) {
        for (; VVar2 = v_local, lVar16 < neg.sz; lVar16 = lVar16 + 1) {
          pCVar8 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[](&this_00->ra,neg.data[lVar16]);
          mkElimClause(pvVar13,VVar2,pCVar8);
        }
        x.x = v_local * 2;
      }
      else {
        for (; VVar2 = v_local, lVar16 < pos.sz; lVar16 = lVar16 + 1) {
          pCVar8 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[](&this_00->ra,pos.data[lVar16]);
          mkElimClause(pvVar13,VVar2,pCVar8);
        }
        x.x = v_local * 2 + 1;
      }
      mkElimClause(pvVar13,x);
      for (lVar16 = 0; lVar16 < pvVar6->sz; lVar16 = lVar16 + 1) {
        removeClause(pSVar17,pvVar6->data[lVar16]);
      }
      out_clause = &(pSVar17->super_Solver).add_tmp;
      for (lVar16 = 0; lVar16 < pos.sz; lVar16 = lVar16 + 1) {
        for (lVar15 = 0; lVar15 < neg.sz; lVar15 = lVar15 + 1) {
          pCVar8 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[](&this_00->ra,pos.data[lVar16]);
          pCVar9 = (Clause *)
                   RegionAllocator<unsigned_int>::operator[](&this_00->ra,neg.data[lVar15]);
          bVar3 = merge(local_68,pCVar8,pCVar9,v_local,out_clause);
          if ((bVar3) && (bVar3 = addClause_(local_68,out_clause), !bVar3)) {
            bVar3 = false;
            goto LAB_00111f4e;
          }
        }
        pSVar17 = local_68;
      }
      pvVar6 = IntMap<int,_Minisat::vec<unsigned_int,_int>,_Minisat::MkIndexDefault<int>_>::
               operator[](&(this->occurs).occs,v_local);
      vec<unsigned_int,_int>::clear(pvVar6,true);
      this_01 = &(pSVar17->super_Solver).watches;
      pvVar10 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>
                ::operator[](&this_01->occs,(Lit)(v_local * 2));
      if (pvVar10->sz == 0) {
        pvVar10 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>
                  ::operator[](&this_01->occs,(Lit)(v_local * 2));
        vec<Minisat::Solver::Watcher,_int>::clear(pvVar10,true);
      }
      pvVar10 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>
                ::operator[](&this_01->occs,(Lit)(v_local * 2 + 1));
      if (pvVar10->sz == 0) {
        pvVar10 = IntMap<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::MkIndexLit>
                  ::operator[](&this_01->occs,(Lit)(v_local * 2 + 1));
        vec<Minisat::Solver::Watcher,_int>::clear(pvVar10,true);
      }
      bVar3 = backwardSubsumptionCheck(local_68,false);
LAB_00111f4e:
      vec<unsigned_int,_int>::~vec(&neg);
      vec<unsigned_int,_int>::~vec(&pos);
      return bVar3;
    }
    puVar7 = RegionAllocator<unsigned_int>::operator[](&this_00->ra,pvVar6->data[lVar16]);
    uVar11 = (ulong)(*puVar7 >> 5);
    uVar12 = 0xffffffffffffffff;
    do {
      uVar14 = uVar11;
      if (uVar12 - uVar11 == -1) break;
      uVar14 = uVar12 + 1;
      lVar15 = uVar12 + 2;
      uVar12 = uVar14;
    } while (puVar7[lVar15] != v_local * 2);
    pvVar13 = &neg;
    if (uVar14 < uVar11) {
      pvVar13 = &pos;
    }
    vec<unsigned_int,_int>::push(pvVar13,pvVar6->data + lVar16);
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (int i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (int i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
    }else{
        for (int i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
    }

    for (int i = 0; i < cls.size(); i++)
        removeClause(cls[i]); 

    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    // Free occurs list for this variable:
    occurs[v].clear(true);
    
    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}